

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EntityMarking::Decode(EntityMarking *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KUINT16 i;
  long lVar2;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    KDataStream::Read(stream,&this->m_ui8EntityMarkingCharacterSet);
    lVar2 = 0;
    do {
      KDataStream::Read(stream,this->m_sEntityMarkingString + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xb);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityMarking::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ENTITY_MARKING_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EntityMarkingCharacterSet;

    for( KUINT16 i = 0; i < 11; ++i )
    {
        stream >> m_sEntityMarkingString[i];
    }
}